

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implementation.cpp
# Opt level: O2

void anon_unknown.dwarf_5e86::fill_array_impl(my_array<double> a)

{
  long lVar1;
  double *pdVar2;
  long lVar3;
  size_t k;
  ulong uVar4;
  long lVar5;
  size_t i;
  ulong uVar6;
  size_t j;
  ulong uVar7;
  undefined1 auVar8 [16];
  int in_stack_00000010;
  int in_stack_00000014;
  int in_stack_00000018;
  
  lVar5 = 0;
  for (uVar6 = 0; uVar6 < (ulong)(long)in_stack_00000010; uVar6 = uVar6 + 1) {
    lVar3 = lVar5;
    for (uVar7 = 0; uVar7 < (ulong)(long)in_stack_00000014; uVar7 = uVar7 + 1) {
      for (uVar4 = 0; uVar4 < (ulong)(long)in_stack_00000018; uVar4 = uVar4 + 1) {
        lVar1 = uVar4 + lVar3;
        auVar8._8_4_ = (int)((ulong)lVar1 >> 0x20);
        auVar8._0_8_ = lVar1;
        auVar8._12_4_ = 0x45300000;
        pdVar2 = custom_array::my_array<double>::operator()
                           ((my_array<double> *)&stack0x00000008,(int)uVar6,(int)uVar7,(int)uVar4);
        *pdVar2 = (auVar8._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0);
      }
      lVar3 = lVar3 + 100;
    }
    lVar5 = lVar5 + 10000;
  }
  return;
}

Assistant:

void fill_array_impl(custom_array::my_array<double> a) {
        for (size_t i = 0; i < a.sizes[0]; ++i)
            for (size_t j = 0; j < a.sizes[1]; ++j)
                for (size_t k = 0; k < a.sizes[2]; ++k) {
                    a(i, j, k) = i * 10000 + j * 100 + k;
                }
    }